

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Windows::CodeCompareReporter::CodeCompareReporter(CodeCompareReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Windows::CODE_COMPARE();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_00156280;
  return;
}

Assistant:

CodeCompareReporter::CodeCompareReporter()
            : GenericDiffReporter(DiffPrograms::Windows::CODE_COMPARE())
        {
        }